

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffdblk(fitsfile *fptr,long nblocks,int *status)

{
  int iVar1;
  FITSfile *pFVar2;
  LONGLONG *pLVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long bytepos;
  long bytepos_00;
  int tstatus;
  char buffer [2880];
  int local_b8c;
  long local_b88;
  long local_b80;
  undefined1 local_b78 [2888];
  
  iVar4 = *status;
  if (0 < nblocks && iVar4 < 1) {
    local_b8c = 0;
    pFVar2 = fptr->Fptr;
    lVar6 = pFVar2->heapstart + pFVar2->datastart + pFVar2->heapsize;
    lVar5 = lVar6 + 0xb3f;
    bytepos = (lVar5 / 0xb40) * 0xb40;
    local_b80 = nblocks * 0xb40;
    bytepos_00 = bytepos + nblocks * -0xb40;
    iVar4 = ffmbyt(fptr,bytepos,0,&local_b8c);
    if (iVar4 == 0) {
      local_b88 = (lVar6 - lVar5 % 0xb40) + 0x167f;
      do {
        iVar4 = ffgbyt(fptr,0xb40,local_b78,&local_b8c);
        if (iVar4 != 0) break;
        ffmbyt(fptr,bytepos_00,0,status);
        ffpbyt(fptr,0xb40,local_b78,status);
        lVar5 = local_b88;
        if (0 < *status) {
          ffxmsg(5,"Error deleting FITS blocks (ffdblk)");
          goto LAB_0013f909;
        }
        bytepos_00 = bytepos_00 + 0xb40;
        iVar4 = ffmbyt(fptr,local_b88,0,&local_b8c);
        local_b88 = lVar5 + 0xb40;
      } while (iVar4 == 0);
    }
    memset(local_b78,0,0xb40);
    ffmbyt(fptr,bytepos_00,0,status);
    do {
      ffpbyt(fptr,0xb40,local_b78,status);
      nblocks = nblocks + -1;
    } while (nblocks != 0);
    ffmbyt(fptr,bytepos_00 + -1,0,status);
    fftrun(fptr,bytepos_00,status);
    pFVar2 = fptr->Fptr;
    iVar4 = pFVar2->curhdu;
    iVar1 = pFVar2->maxhdu;
    if (iVar4 <= iVar1) {
      pLVar3 = pFVar2->headstart;
      lVar5 = 0;
      do {
        pLVar3[(long)iVar4 + lVar5 + 1] = pLVar3[(long)iVar4 + lVar5 + 1] - local_b80;
        lVar5 = lVar5 + 1;
      } while ((iVar1 - iVar4) + 1 != (int)lVar5);
    }
LAB_0013f909:
    iVar4 = *status;
  }
  return iVar4;
}

Assistant:

int ffdblk(fitsfile *fptr,      /* I - FITS file pointer                    */
           long nblocks,        /* I - number of 2880-byte blocks to delete */
           int *status)         /* IO - error status                        */
/*
  Delete the specified number of 2880-byte blocks from the end
  of the CHDU by shifting all following extensions up this 
  number of blocks.
*/
{
    char buffer[2880];
    int tstatus, ii;
    LONGLONG readpos, writepos;

    if (*status > 0 || nblocks <= 0)
        return(*status);

    tstatus = 0;
    /* pointers to the read and write positions */

    readpos = (fptr->Fptr)->datastart + 
                   (fptr->Fptr)->heapstart + 
                   (fptr->Fptr)->heapsize;
    readpos = ((readpos + 2879) / 2880) * 2880; /* start of block */

/*  the following formula is wrong because the current data unit
    may have been extended without updating the headstart value
    of the following HDU.
    
    readpos = (fptr->Fptr)->headstart[((fptr->Fptr)->curhdu) + 1];
*/
    writepos = readpos - ((LONGLONG)nblocks * 2880);

    while ( !ffmbyt(fptr, readpos, REPORT_EOF, &tstatus) &&
            !ffgbyt(fptr, 2880L, buffer, &tstatus) )
    {
        ffmbyt(fptr, writepos, REPORT_EOF, status);
        ffpbyt(fptr, 2880L, buffer, status);

        if (*status > 0)
        {
           ffpmsg("Error deleting FITS blocks (ffdblk)");
           return(*status);
        }
        readpos  += 2880;  /* increment to next block to transfer */
        writepos += 2880;
    }

    /* now fill the last nblock blocks with zeros */
    memset(buffer, 0, 2880);
    ffmbyt(fptr, writepos, REPORT_EOF, status);

    for (ii = 0; ii < nblocks; ii++)
        ffpbyt(fptr, 2880L, buffer, status);

    /* move back before the deleted blocks, since they may be deleted */
    /*   and we do not want to delete the current active buffer */
    ffmbyt(fptr, writepos - 1, REPORT_EOF, status);

    /* truncate the file to the new size, if supported on this device */
    fftrun(fptr, writepos, status);

    /* recalculate the starting location of all subsequent HDUs */
    for (ii = (fptr->Fptr)->curhdu; ii <= (fptr->Fptr)->maxhdu; ii++)
         (fptr->Fptr)->headstart[ii + 1] -= ((LONGLONG)nblocks * 2880);

    return(*status);
}